

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ioWriteEqn.c
# Opt level: O0

void Io_WriteEqn(Abc_Ntk_t *pNtk,char *pFileName)

{
  char *pcVar1;
  int iVar2;
  FILE *__stream;
  char *pcVar3;
  FILE *pFile;
  char *pFileName_local;
  Abc_Ntk_t *pNtk_local;
  
  iVar2 = Abc_NtkIsAigNetlist(pNtk);
  if (iVar2 == 0) {
    __assert_fail("Abc_NtkIsAigNetlist(pNtk)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/io/ioWriteEqn.c"
                  ,0x36,"void Io_WriteEqn(Abc_Ntk_t *, char *)");
  }
  iVar2 = Abc_NtkLatchNum(pNtk);
  if (0 < iVar2) {
    printf("Warning: only combinational portion is being written.\n");
  }
  iVar2 = Io_NtkWriteEqnCheck(pNtk);
  if (iVar2 != 0) {
    __stream = fopen(pFileName,"w");
    if (__stream == (FILE *)0x0) {
      fprintf(_stdout,"Io_WriteEqn(): Cannot open the output file \"%s\".\n",pFileName);
    }
    else {
      pcVar1 = pNtk->pName;
      pcVar3 = Extra_TimeStamp();
      fprintf(__stream,"# Equations for \"%s\" written by ABC on %s\n",pcVar1,pcVar3);
      Io_NtkWriteEqnOne((FILE *)__stream,pNtk);
      fprintf(__stream,"\n");
      fclose(__stream);
    }
  }
  return;
}

Assistant:

void Io_WriteEqn( Abc_Ntk_t * pNtk, char * pFileName )
{
    FILE * pFile;

    assert( Abc_NtkIsAigNetlist(pNtk) );
    if ( Abc_NtkLatchNum(pNtk) > 0 )
        printf( "Warning: only combinational portion is being written.\n" );

    // check that the names are fine for the EQN format
    if ( !Io_NtkWriteEqnCheck(pNtk) )
        return;

    // start the output stream
    pFile = fopen( pFileName, "w" );
    if ( pFile == NULL )
    {
        fprintf( stdout, "Io_WriteEqn(): Cannot open the output file \"%s\".\n", pFileName );
        return;
    }
    fprintf( pFile, "# Equations for \"%s\" written by ABC on %s\n", pNtk->pName, Extra_TimeStamp() );

    // write the equations for the network
    Io_NtkWriteEqnOne( pFile, pNtk );
	fprintf( pFile, "\n" );
	fclose( pFile );
}